

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O1

void __thiscall DPusher::Serialize(DPusher *this,FArchive *arc)

{
  FArchive *pFVar1;
  BYTE val;
  undefined1 local_19;
  
  DObject::Serialize((DObject *)this,arc);
  local_19 = (undefined1)this->m_Type;
  FArchive::operator<<(arc,&local_19);
  this->m_Type = (uint)(byte)local_19;
  pFVar1 = FArchive::SerializeObject
                     (arc,(DObject **)&this->m_Source,AActor::RegistrationInfo.MyClass);
  pFVar1 = ::operator<<(pFVar1,&this->m_PushVec);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Magnitude);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Radius);
  FArchive::operator<<(pFVar1,(DWORD *)&this->m_Affectee);
  return;
}

Assistant:

void DPusher::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << m_Type
		<< m_Source
		<< m_PushVec
		<< m_Magnitude
		<< m_Radius
		<< m_Affectee;
}